

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdeadlinetimer.cpp
# Opt level: O2

void __thiscall
QDeadlineTimer::setRemainingTime(QDeadlineTimer *this,qint64 msecs,TimerType timerType)

{
  long lVar1;
  long lVar2;
  QDeadlineTimer QVar3;
  
  if (msecs < 0) {
    this->t1 = 0x7fffffffffffffff;
    this->t2 = 0;
    this->type = timerType;
  }
  else {
    if (msecs == 0) {
      this->t2 = 0;
      this->type = timerType;
      lVar2 = -0x8000000000000000;
    }
    else {
      QVar3 = current(timerType);
      this->t2 = (int)QVar3._8_8_;
      this->type = (int)((ulong)QVar3._8_8_ >> 0x20);
      lVar1 = msecs * 1000000;
      lVar2 = 0x7fffffffffffffff;
      if ((SEXT816(lVar1) == SEXT816(msecs) * SEXT416(1000000)) && (!SCARRY8(QVar3.t1,lVar1))) {
        lVar2 = QVar3.t1 + lVar1;
      }
    }
    this->t1 = lVar2;
  }
  return;
}

Assistant:

void QDeadlineTimer::setRemainingTime(qint64 msecs, Qt::TimerType timerType) noexcept
{
    if (msecs < 0) {
        *this = QDeadlineTimer(Forever, timerType);
    } else if (msecs == 0) {
        *this = QDeadlineTimer(timerType);
        t1 = std::numeric_limits<qint64>::min();
    } else {
        *this = current(timerType);
        milliseconds ms(msecs);
        t1 = add_saturate(t1, ms);
    }
}